

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knote.c
# Opt level: O1

knote * knote_index_RB_REMOVE(knote_index *head,knote *elm)

{
  knote *pkVar1;
  knote *pkVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  knote *pkVar6;
  knote *elm_00;
  knote *pkVar7;
  anon_struct_32_4_548b78d9_for_kn_index *paVar8;
  
  pkVar6 = (elm->kn_index).rbe_left;
  pkVar7 = (elm->kn_index).rbe_right;
  elm_00 = pkVar7;
  if ((pkVar6 == (knote *)0x0) || (elm_00 = pkVar6, pkVar7 == (knote *)0x0)) {
    pkVar7 = (elm->kn_index).rbe_parent;
    iVar5 = (elm->kn_index).rbe_color;
    if (elm_00 != (knote *)0x0) {
      (elm_00->kn_index).rbe_parent = pkVar7;
    }
    if (pkVar7 == (knote *)0x0) {
      head->rbh_root = elm_00;
      pkVar7 = (knote *)0x0;
    }
    else if ((pkVar7->kn_index).rbe_left == elm) {
      (pkVar7->kn_index).rbe_left = elm_00;
    }
    else {
      (pkVar7->kn_index).rbe_right = elm_00;
    }
  }
  else {
    do {
      pkVar6 = pkVar7;
      pkVar7 = (pkVar6->kn_index).rbe_left;
    } while (pkVar7 != (knote *)0x0);
    elm_00 = (pkVar6->kn_index).rbe_right;
    pkVar7 = (pkVar6->kn_index).rbe_parent;
    iVar5 = (pkVar6->kn_index).rbe_color;
    if (elm_00 != (knote *)0x0) {
      (elm_00->kn_index).rbe_parent = pkVar7;
    }
    paVar8 = (anon_struct_32_4_548b78d9_for_kn_index *)head;
    if (pkVar7 != (knote *)0x0) {
      paVar8 = (anon_struct_32_4_548b78d9_for_kn_index *)&(pkVar7->kn_index).rbe_right;
      if ((pkVar7->kn_index).rbe_left == pkVar6) {
        paVar8 = &pkVar7->kn_index;
      }
    }
    paVar8->rbe_left = elm_00;
    if ((pkVar6->kn_index).rbe_parent == elm) {
      pkVar7 = pkVar6;
    }
    pkVar1 = (elm->kn_index).rbe_left;
    pkVar2 = (elm->kn_index).rbe_right;
    iVar3 = (elm->kn_index).rbe_color;
    uVar4 = *(undefined4 *)&(elm->kn_index).field_0x1c;
    (pkVar6->kn_index).rbe_parent = (elm->kn_index).rbe_parent;
    (pkVar6->kn_index).rbe_color = iVar3;
    *(undefined4 *)&(pkVar6->kn_index).field_0x1c = uVar4;
    (pkVar6->kn_index).rbe_left = pkVar1;
    (pkVar6->kn_index).rbe_right = pkVar2;
    pkVar1 = (elm->kn_index).rbe_parent;
    paVar8 = (anon_struct_32_4_548b78d9_for_kn_index *)head;
    if (pkVar1 != (knote *)0x0) {
      paVar8 = (anon_struct_32_4_548b78d9_for_kn_index *)&(pkVar1->kn_index).rbe_right;
      if ((pkVar1->kn_index).rbe_left == elm) {
        paVar8 = &pkVar1->kn_index;
      }
    }
    paVar8->rbe_left = pkVar6;
    (((elm->kn_index).rbe_left)->kn_index).rbe_parent = pkVar6;
    pkVar1 = (elm->kn_index).rbe_right;
    if (pkVar1 != (knote *)0x0) {
      (pkVar1->kn_index).rbe_parent = pkVar6;
    }
  }
  if (iVar5 == 0) {
    knote_index_RB_REMOVE_COLOR(head,pkVar7,elm_00);
  }
  return elm;
}

Assistant:

struct knote *
knote_new(void)
{
    struct knote *res;

    res = calloc(1, sizeof(struct knote));
    if (res == NULL)
        return (NULL);

    res->kn_ref = 1;

    return (res);
}